

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  uint uVar1;
  uint uVar2;
  long number_to_print;
  char *string;
  double dVar3;
  double dVar4;
  
  if (input_number < 0.0) {
    putchar(0x2d);
    input_number = -input_number;
  }
  if (NAN(input_number)) {
    string = "NaN";
  }
  else {
    if (ABS(input_number) == INFINITY) {
      UnityPrintLen("Infinity",3);
      return;
    }
    if ((5e-07 < input_number) || (input_number <= 0.0)) {
      if (4294967295.9999995 <= input_number) {
        number_to_print = 9;
        for (dVar3 = 10.0; dVar4 = input_number / dVar3, 999999999.5 <= dVar4; dVar3 = dVar3 * 10.0)
        {
          number_to_print = number_to_print + 1;
        }
        uVar1 = (uint)(dVar4 + 0.5);
        uVar2 = uVar1;
        if ((dVar4 < (double)(int)(dVar4 + 0.5)) && (dVar4 - (double)(int)(uVar1 - 1) <= 0.5)) {
          uVar2 = uVar1 - 1;
          if ((uVar1 & 1) == 0) {
            uVar2 = uVar1;
          }
          if (1e+22 <= input_number) {
            uVar2 = uVar1;
          }
        }
        putchar((int)uVar2 / 100000000 + 0x30);
        UnityPrintDecimalAndNumberWithLeadingZeros((int)uVar2 % 100000000,10000000);
        putchar(0x65);
        putchar(0x2b);
        if ((uint)number_to_print < 10) {
          putchar(0x30);
        }
        UnityPrintNumber(number_to_print);
        return;
      }
      dVar3 = (input_number - (double)((long)input_number & 0xffffffff)) * 1000000.0;
      uVar1 = (uint)(dVar3 + 0.5);
      uVar2 = uVar1;
      if ((dVar3 < (double)(int)(dVar3 + 0.5)) && (dVar3 - (double)(int)(uVar1 - 1) <= 0.5)) {
        uVar2 = uVar1 - 1;
        if ((uVar1 & 1) == 0) {
          uVar2 = uVar1;
        }
        if (1e+22 <= input_number) {
          uVar2 = uVar1;
        }
      }
      uVar1 = 0;
      if (uVar2 != 1000000) {
        uVar1 = uVar2;
      }
      UnityPrintNumberUnsigned((ulong)((uint)(uVar2 == 1000000) + (int)(long)input_number));
      UnityPrintDecimalAndNumberWithLeadingZeros(uVar1,100000);
      return;
    }
    string = "0.000000...";
  }
  UnityPrint(string);
  return;
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
    UNITY_DOUBLE number;

    if (input_number < 0)
    {
        UNITY_OUTPUT_CHAR('-');
        number = -input_number;
    } else
    {
        number = input_number;
    }

    if (isnan(number)) UnityPrint(UnityStrNaN);
    else if (isinf(number)) UnityPrintLen(UnityStrInf, 3);
    else if (number <= 0.0000005 && number > 0) UnityPrint("0.000000..."); /* Small number */
    else if (number < 4294967295.9999995) /* Rounded result fits in 32 bits, "%.6f" format */
    {
        const UNITY_INT32 divisor = 1000000/10;
        UNITY_UINT32 integer_part = (UNITY_UINT32)number;
        UNITY_INT32 fraction_part = (UNITY_INT32)((number - (UNITY_DOUBLE)integer_part)*1000000.0 + 0.5);
        /* Double precision calculation gives best performance for six rounded decimal places */
        ROUND_TIES_TO_EVEN(number, fraction_part, (number - (UNITY_DOUBLE)integer_part)*1000000.0);

        if (fraction_part == 1000000) /* Carry across the decimal point */
        {
            fraction_part = 0;
            integer_part += 1;
        }

        UnityPrintNumberUnsigned(integer_part);
        UnityPrintDecimalAndNumberWithLeadingZeros(fraction_part, divisor);
    }
    else /* Number is larger, use exponential format of 9 digits, "%.8e" */
    {
        const UNITY_INT32 divisor = 1000000000/10;
        UNITY_INT32 integer_part;
        UNITY_DOUBLE_TYPE divide = 10.0;
        int exponent = 9;

        while (number / divide >= 1000000000.0 - 0.5)
        {
            divide *= 10;
            exponent++;
        }
        integer_part = (UNITY_INT32)(number / divide + 0.5);
        /* Double precision calculation required for float, to produce 9 rounded digits */
        ROUND_TIES_TO_EVEN(number, integer_part, number / divide);

        UNITY_OUTPUT_CHAR('0' + integer_part / divisor);
        UnityPrintDecimalAndNumberWithLeadingZeros(integer_part % divisor, divisor / 10);
        UNITY_OUTPUT_CHAR('e');
        UNITY_OUTPUT_CHAR('+');
        if (exponent < 10) UNITY_OUTPUT_CHAR('0');
        UnityPrintNumber(exponent);
    }
}